

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

void * __thiscall controller::findHandle(controller *this,string *key)

{
  code *pcVar1;
  bool bVar2;
  int *piVar3;
  string tmp_1;
  listNode *p_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string *p;
  string tmp;
  void *result;
  void *fetch;
  robj okey;
  string *key_local;
  controller *this_local;
  
  fetch._0_4_ = 0;
  tmp.field_2._8_8_ = 0;
  okey._0_8_ = key;
  okey.ptr = key;
  piVar3 = (int *)dic::dictFetchValue(&this->dcdb,this->dictidx,&fetch);
  if (piVar3 == (int *)0x0) {
    this_local = (controller *)0x0;
  }
  else if (*piVar3 == 0) {
    this_local = *(controller **)(piVar3 + 2);
  }
  else if (*piVar3 == 2) {
    std::__cxx11::string::string((string *)&p);
    local_68 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(piVar3 + 2);
    while( true ) {
      bVar2 = std::operator!=(local_68,"");
      if (!bVar2) break;
      std::__cxx11::string::operator+=((string *)&p,*(string **)(piVar3 + 2));
      local_68 = local_68 + 1;
    }
    this_local = (controller *)&p;
    tmp.field_2._8_8_ = this_local;
    std::__cxx11::string::~string((string *)&p);
  }
  else {
    if (*piVar3 != 1) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    tmp_1.field_2._8_8_ = *(undefined8 *)(piVar3 + 2);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff60);
    for (; tmp_1.field_2._8_8_ != 0; tmp_1.field_2._8_8_ = *(undefined8 *)(tmp_1.field_2._8_8_ + 8))
    {
      std::__cxx11::string::operator+=
                ((string *)&stack0xffffffffffffff60,*(string **)(tmp_1.field_2._8_8_ + 0x10));
    }
    this_local = (controller *)&stack0xffffffffffffff60;
    tmp.field_2._8_8_ = this_local;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  }
  return this_local;
}

Assistant:

void * controller::findHandle(std::string key){
    robj okey;
    okey.objtype=_string;
    okey.ptr=&key;
    void *fetch=NULL;
    void *result=NULL;
    fetch=controller::dcdb.dictFetchValue(controller::dictidx,&okey);
    if(fetch==NULL)
        return fetch;
    else if(((robj *)fetch)->objtype==_string)
        return ((robj *)fetch)->ptr;//consider to return string 
    else if (((robj *)fetch)->objtype==_set){
        std::string tmp;
        std::string *p=((std::string *)(((robj *)fetch)->ptr));
        while(*p++!="\0"){
            tmp+=*((std::string *)(((robj *)fetch)->ptr));
        }
        result=&tmp;
        return result;
    }
    else if(((robj *)fetch)->objtype==_list){
        listNode *p=(listNode *)(((robj *)fetch)->ptr);
        std::string tmp;
        while(p!=NULL){
            tmp+=*((std::string *)p->value);
            p=p->next;  
        }
        result=&tmp;
        return result;
    }
}